

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

put_transaction<Func> * __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
::
start_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func>
          (put_transaction<Func> *__return_storage_ptr__,
          conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
          *this)

{
  put_transaction<Func> local_68;
  put_transaction<Func> local_50;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,(mutex_type *)this);
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  start_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func>
            (&local_68,
             (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)(this + 0x28));
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::put_transaction
            (&local_50,0,(unique_lock<std::mutex> *)local_28,&local_68);
  put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func>
  ::
  put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func,void>
            ((put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func>
              *)__return_storage_ptr__,&local_50);
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction(&local_50);
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction(&local_68);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::unique_lock<std::mutex> lock(m_mutex);
            return put_transaction<ELEMENT_TYPE>(
              PrivateType(),
              std::move(lock),
              m_queue.template start_emplace<ELEMENT_TYPE>(
                std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...));
        }